

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

bool find_str_and_remove(char *s,char *target)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  bool matches;
  int tot_len;
  int len;
  int j;
  int i;
  int start;
  char *target_local;
  char *s_local;
  
  sVar2 = strlen(target);
  sVar3 = strlen(s);
  bVar1 = false;
  len = 0;
  do {
    if ((int)sVar3 <= len) {
      return false;
    }
    for (tot_len = 0; tot_len < (int)sVar2; tot_len = tot_len + 1) {
      bVar1 = case_compare(s[len + tot_len],target[tot_len]);
      if (!bVar1) {
        bVar1 = false;
        break;
      }
      bVar1 = true;
    }
    if (bVar1) {
      for (tot_len = len + (int)sVar2; tot_len <= (int)sVar3; tot_len = tot_len + 1) {
        s[len] = s[tot_len];
        len = len + 1;
      }
      return true;
    }
    len = len + 1;
  } while( true );
}

Assistant:

bool
find_str_and_remove(char *s, const char *target)
{
  // uses a dumb algorithm
  int start, i, j;
  int len = strlen(target);
  int tot_len = strlen(s);
  bool matches = false;
  for (i = 0; i < tot_len; i++) {
    start = i;
    for (j = 0; j < len; j++) {
      if (case_compare(s[i + j], target[j]))
        matches = true;
      else {
        matches = false;
        break;
      }
    }
    if (matches) {
      for (i = start, j = start + len; j <= tot_len; i++, j++)
        // use <= on j so also copies the zero at the end
        s[i] = s[j];
      return true;
    }
  }
  // if get to here, then no match
  return false;
}